

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

double Assimp::FBX::FBXConverter::FrameRateToDouble(FrameRate fp,double customFPSVal)

{
  double customFPSVal_local;
  double dStack_10;
  FrameRate fp_local;
  
  switch(fp) {
  case FrameRate_DEFAULT:
    dStack_10 = 1.0;
    break;
  case FrameRate_120:
    dStack_10 = 120.0;
    break;
  case FrameRate_100:
    dStack_10 = 100.0;
    break;
  case FrameRate_60:
    dStack_10 = 60.0;
    break;
  case FrameRate_50:
    dStack_10 = 50.0;
    break;
  case FrameRate_48:
    dStack_10 = 48.0;
    break;
  case FrameRate_30:
  case FrameRate_30_DROP:
    dStack_10 = 30.0;
    break;
  case FrameRate_NTSC_DROP_FRAME:
  case FrameRate_NTSC_FULL_FRAME:
    dStack_10 = 29.9700262;
    break;
  case FrameRate_PAL:
    dStack_10 = 25.0;
    break;
  case FrameRate_CINEMA:
    dStack_10 = 24.0;
    break;
  case FrameRate_1000:
    dStack_10 = 1000.0;
    break;
  case FrameRate_CINEMA_ND:
    dStack_10 = 23.976;
    break;
  case FrameRate_CUSTOM:
    dStack_10 = customFPSVal;
    break;
  case FrameRate_MAX:
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXConverter.cpp"
                  ,0x969,
                  "static double Assimp::FBX::FBXConverter::FrameRateToDouble(FileGlobalSettings::FrameRate, double)"
                 );
  }
  return dStack_10;
}

Assistant:

double FBXConverter::FrameRateToDouble(FileGlobalSettings::FrameRate fp, double customFPSVal) {
            switch (fp) {
            case FileGlobalSettings::FrameRate_DEFAULT:
                return 1.0;

            case FileGlobalSettings::FrameRate_120:
                return 120.0;

            case FileGlobalSettings::FrameRate_100:
                return 100.0;

            case FileGlobalSettings::FrameRate_60:
                return 60.0;

            case FileGlobalSettings::FrameRate_50:
                return 50.0;

            case FileGlobalSettings::FrameRate_48:
                return 48.0;

            case FileGlobalSettings::FrameRate_30:
            case FileGlobalSettings::FrameRate_30_DROP:
                return 30.0;

            case FileGlobalSettings::FrameRate_NTSC_DROP_FRAME:
            case FileGlobalSettings::FrameRate_NTSC_FULL_FRAME:
                return 29.9700262;

            case FileGlobalSettings::FrameRate_PAL:
                return 25.0;

            case FileGlobalSettings::FrameRate_CINEMA:
                return 24.0;

            case FileGlobalSettings::FrameRate_1000:
                return 1000.0;

            case FileGlobalSettings::FrameRate_CINEMA_ND:
                return 23.976;

            case FileGlobalSettings::FrameRate_CUSTOM:
                return customFPSVal;

            case FileGlobalSettings::FrameRate_MAX: // this is to silence compiler warnings
                break;
            }

            ai_assert(false);

            return -1.0f;
        }